

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

QUuid __thiscall VcprojGenerator::getProjectUUID(VcprojGenerator *this,QString *filename)

{
  QStringView v;
  FILE *__stream;
  bool bVar1;
  ulong *puVar2;
  char *pcVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  bool validUUID;
  QByteArray digest;
  QString abspath;
  QUuid uuid;
  ProString *in_stack_fffffffffffffcc8;
  ProString *in_stack_fffffffffffffcd0;
  QMakeProject *this_00;
  QAnyStringView *in_stack_fffffffffffffcd8;
  undefined6 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  QMakeEvaluator *in_stack_fffffffffffffce8;
  qsizetype in_stack_fffffffffffffcf0;
  qsizetype in_stack_fffffffffffffcf8;
  byte local_291;
  undefined1 local_238 [120];
  undefined1 local_1c0 [96];
  storage_type *local_160;
  Algorithm local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  QAnyStringView *local_48;
  QUuid local_28;
  QUuid local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_291 = 1;
  local_18.data1 = 0xaaaaaaaa;
  local_18.data2 = 0xaaaa;
  local_18.data3 = 0xaaaa;
  local_18.data4[0] = 0xaa;
  local_18.data4[1] = 0xaa;
  local_18.data4[2] = 0xaa;
  local_18.data4[3] = 0xaa;
  local_18.data4[4] = 0xaa;
  local_18.data4[5] = 0xaa;
  local_18.data4[6] = 0xaa;
  local_18.data4[7] = 0xaa;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
  QMakeEvaluator::first
            (in_stack_fffffffffffffce8,
             (ProKey *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)));
  QStringView::QStringView<QString,_true>
            ((QStringView *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)),
             (QString *)in_stack_fffffffffffffcd8);
  QStringView::mid((QStringView *)in_stack_fffffffffffffce8,in_stack_fffffffffffffcf8,
                   in_stack_fffffffffffffcf0);
  v.m_size._6_1_ = in_stack_fffffffffffffce6;
  v.m_size._0_6_ = in_stack_fffffffffffffce0;
  v.m_size._7_1_ = in_stack_fffffffffffffce7;
  v.m_data = (storage_type_conflict *)in_stack_fffffffffffffce8;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffcd8,v);
  local_18 = (QUuid)QUuid::fromString(local_48);
  ProString::~ProString((ProString *)0x2898f9);
  ProKey::~ProKey((ProKey *)0x289906);
  bVar1 = QUuid::isNull(&local_18);
  if (!bVar1) {
    bVar1 = QString::isEmpty((QString *)0x289924);
    if (bVar1) goto LAB_00289b5f;
  }
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  local_b0 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QString::isEmpty((QString *)0x289966);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
    QMakeEvaluator::first
              (in_stack_fffffffffffffce8,
               (ProKey *)
               CONCAT17(in_stack_fffffffffffffce7,
                        CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)));
    ProString::toQString(in_stack_fffffffffffffcc8);
  }
  else {
    QString::QString(&in_stack_fffffffffffffcd0->m_string,&in_stack_fffffffffffffcc8->m_string);
  }
  Option::fixPathToTargetOS
            ((QString *)in_stack_fffffffffffffce8,(bool)in_stack_fffffffffffffce7,
             (bool)in_stack_fffffffffffffce6);
  QString::~QString((QString *)0x289a20);
  if (bVar1) {
    ProString::~ProString((ProString *)0x289a39);
    ProKey::~ProKey((ProKey *)0x289a52);
  }
  local_150 = 0xaaaaaaaaaaaaaaaa;
  local_148 = 0xaaaaaaaaaaaaaaaa;
  local_140 = 0xaaaaaaaaaaaaaaaa;
  QString::toUtf8(&in_stack_fffffffffffffcc8->m_string);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)),
             (QByteArray *)in_stack_fffffffffffffcd8);
  QVar4.m_data = local_160;
  QVar4.m_size = (qsizetype)&local_150;
  QCryptographicHash::hash(QVar4,local_158);
  QByteArray::~QByteArray((QByteArray *)0x289ad8);
  puVar2 = (ulong *)QByteArray::constData((QByteArray *)0x289ae5);
  local_18._0_8_ = *puVar2;
  local_18.data4 = *(uchar (*) [8])(puVar2 + 1);
  bVar1 = QUuid::isNull(&local_18);
  local_291 = (bVar1 ^ 0xffU) & 1;
  local_18.data4 = (uchar  [8])((ulong)local_18.data4 & 0xffffffffffffff3f | 0x80);
  local_18._0_8_ = local_18._0_8_ & 0xfffffffffffffff | 0x3000000000000000;
  QByteArray::~QByteArray((QByteArray *)0x289b52);
  QString::~QString((QString *)0x289b5f);
LAB_00289b5f:
  bVar1 = QUuid::isNull(&local_18);
  if ((bVar1) || (local_291 == 0)) {
    local_28 = (QUuid)QUuid::createUuid();
    __stream = _stderr;
    local_18 = local_28;
    QUuid::toString((StringFormat)local_1c0);
    QString::toUpper(&in_stack_fffffffffffffcc8->m_string);
    QString::toLatin1(&in_stack_fffffffffffffcc8->m_string);
    pcVar3 = QByteArray::constData((QByteArray *)0x289c10);
    fprintf(__stream,
            "qmake couldn\'t create a GUID based on filepath, and we couldn\'t\nfind a valid GUID in the .pro file (Consider adding\n\'GUID = %s\'  to the .pro file)\n"
            ,pcVar3);
    QByteArray::~QByteArray((QByteArray *)0x289c33);
    QString::~QString((QString *)0x289c40);
    QString::~QString((QString *)0x289c4d);
  }
  QUuid::toString((StringFormat)local_238);
  QString::toUpper(&in_stack_fffffffffffffcc8->m_string);
  ProString::ProString(in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->m_string);
  ProStringList::ProStringList((ProStringList *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8)
  ;
  this_00 = *(QMakeProject **)(in_RDI + 0xd8);
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_fffffffffffffcc8);
  QMakeProject::values(this_00,(ProKey *)in_stack_fffffffffffffcc8);
  ProStringList::operator=((ProStringList *)this_00,(ProStringList *)in_stack_fffffffffffffcc8);
  ProKey::~ProKey((ProKey *)0x289cfe);
  ProStringList::~ProStringList((ProStringList *)0x289d08);
  ProString::~ProString((ProString *)0x289d12);
  QString::~QString((QString *)0x289d1c);
  QString::~QString((QString *)0x289d26);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QUuid VcprojGenerator::getProjectUUID(const QString &filename)
{
    bool validUUID = true;

    // Read GUID from variable-space
    auto uuid = QUuid::fromString(project->first("GUID").toQStringView());

    // If none, create one based on the MD5 of absolute project path
    if(uuid.isNull() || !filename.isEmpty()) {
        QString abspath = Option::fixPathToTargetOS(
                    filename.isEmpty() ? project->first("QMAKE_MAKEFILE").toQString() : filename);
        QByteArray digest = QCryptographicHash::hash(abspath.toUtf8(), QCryptographicHash::Sha1);
        memcpy((unsigned char*)(&uuid), digest.constData(), sizeof(QUuid));
        validUUID = !uuid.isNull();
        uuid.data4[0] = (uuid.data4[0] & 0x3F) | 0x80; // UV_DCE variant
        uuid.data3 = (uuid.data3 & 0x0FFF) | (QUuid::Name<<12);
    }

    // If still not valid, generate new one, and suggest adding to .pro
    if(uuid.isNull() || !validUUID) {
        uuid = QUuid::createUuid();
        fprintf(stderr,
                "qmake couldn't create a GUID based on filepath, and we couldn't\nfind a valid GUID in the .pro file (Consider adding\n'GUID = %s'  to the .pro file)\n",
                uuid.toString().toUpper().toLatin1().constData());
    }

    // Store GUID in variable-space
    project->values("GUID") = ProStringList(uuid.toString().toUpper());
    return uuid;
}